

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointToArcTangents.cpp
# Opt level: O0

int GeoCalcs::PointToArcTangents
              (LLPoint *point,LLPoint *center,double radius,LLPoint *tanPt1,LLPoint *tanPt2,
              double dTol)

{
  double dVar1;
  double dVar2;
  LLPoint LVar3;
  bool local_bc;
  bool local_ba;
  double radCrs_1;
  double local_a0;
  double radCrs;
  double local_88;
  int local_7c;
  double dStack_78;
  int k;
  double dErr;
  double dStack_68;
  int maxCount;
  double c;
  double crsFromCenter;
  InverseResult result;
  double dTol_local;
  LLPoint *tanPt2_local;
  LLPoint *tanPt1_local;
  double radius_local;
  LLPoint *center_local;
  LLPoint *point_local;
  
  result.distance = dTol;
  INVERSE_RESULT::INVERSE_RESULT((INVERSE_RESULT *)&crsFromCenter);
  DistVincenty(point,center,(InverseResult *)&crsFromCenter);
  if (result.distance <= ABS(result.reverseAzimuth - radius)) {
    if (radius <= result.reverseAzimuth) {
      dVar1 = tan(radius / kSphereRadius);
      dVar2 = tan(result.reverseAzimuth / kSphereRadius);
      dStack_68 = acos(dVar1 / dVar2);
      dStack_78 = 0.0;
      local_7c = 0;
      while( true ) {
        local_ba = true;
        if (local_7c != 0) {
          local_ba = result.distance < ABS(dStack_78) && local_7c < 0xf;
        }
        if (!local_ba) break;
        LVar3 = DestVincenty(center,result.azimuth + dStack_68,radius);
        radCrs = LVar3.latitude;
        tanPt1->latitude = radCrs;
        local_88 = LVar3.longitude;
        tanPt1->longitude = local_88;
        DistVincenty(tanPt1,center,(InverseResult *)&crsFromCenter);
        dVar1 = crsFromCenter;
        DistVincenty(tanPt1,point,(InverseResult *)&crsFromCenter);
        dVar1 = SignAzimuthDifference(dVar1,crsFromCenter);
        dStack_78 = ABS(dVar1) - 1.5707963267948966;
        dStack_68 = dStack_68 + dStack_78;
        local_7c = local_7c + 1;
      }
      local_7c = 0;
      dStack_78 = 0.0;
      while( true ) {
        local_bc = true;
        if (local_7c != 0) {
          local_bc = result.distance < ABS(dStack_78) && local_7c < 0xf;
        }
        if (!local_bc) break;
        LVar3 = DestVincenty(center,result.azimuth - dStack_68,radius);
        radCrs_1 = LVar3.latitude;
        tanPt2->latitude = radCrs_1;
        local_a0 = LVar3.longitude;
        tanPt2->longitude = local_a0;
        DistVincenty(tanPt2,center,(InverseResult *)&crsFromCenter);
        dVar1 = crsFromCenter;
        DistVincenty(tanPt2,point,(InverseResult *)&crsFromCenter);
        dVar1 = SignAzimuthDifference(dVar1,crsFromCenter);
        dStack_78 = ABS(dVar1) - 1.5707963267948966;
        dStack_68 = dStack_68 + dStack_78;
        local_7c = local_7c + 1;
      }
      point_local._4_4_ = 1;
    }
    else {
      point_local._4_4_ = 0;
    }
  }
  else {
    tanPt1->latitude = point->latitude;
    tanPt1->longitude = point->longitude;
    point_local._4_4_ = 1;
  }
  return point_local._4_4_;
}

Assistant:

int PointToArcTangents(const LLPoint &point, const LLPoint &center, double radius,
                           LLPoint &tanPt1, LLPoint &tanPt2, double dTol)
    {
        InverseResult result;
        DistVincenty(point, center, result);
        const double crsFromCenter = result.reverseAzimuth;

        if (fabs(result.distance - radius) < dTol)
        {
            tanPt1 = point;
            return 1;
        }

        if (result.distance < radius)
        {
            return 0;
        }

        double c = acos(tan(radius / kSphereRadius) / tan(result.distance / kSphereRadius));
        const int maxCount = 15;
        double dErr = 0.0;
        int k = 0;
        while (k == 0 || (fabs(dErr) > dTol && k < maxCount))
        {
            tanPt1 = DestVincenty(center, crsFromCenter + c, radius);
            DistVincenty(tanPt1, center, result);
            const double radCrs = result.azimuth;

            DistVincenty(tanPt1, point, result);
            dErr = fabs(SignAzimuthDifference(radCrs, result.azimuth)) - M_PI_2;
            c = c + dErr;
            k++;
        }

        k = 0;
        dErr = 0.0;
        while (k == 0 || (fabs(dErr) > dTol && k < maxCount))
        {
            tanPt2 = DestVincenty(center, crsFromCenter - c, radius);
            DistVincenty(tanPt2, center, result);
            const double radCrs = result.azimuth;

            DistVincenty(tanPt2, point, result);
            dErr = fabs(SignAzimuthDifference(radCrs, result.azimuth)) - M_PI_2;
            c = c + dErr;
            k++;
        }

        return 1;
    }